

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int ARGBComputeCumulativeSum
              (uint8_t *src_argb,int src_stride_argb,int32_t *dst_cumsum,int dst_stride32_cumsum,
              int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  int32_t *piVar4;
  
  iVar1 = -1;
  if ((0 < height && 0 < width) && (src_argb != (uint8_t *)0x0 && dst_cumsum != (int32_t *)0x0)) {
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((uVar2 & 0x20) == 0) {
      pcVar3 = ComputeCumulativeSumRow_C;
    }
    else {
      pcVar3 = ComputeCumulativeSumRow_SSE2;
    }
    memset(dst_cumsum,0,(ulong)(uint)width << 4);
    if (0 < height) {
      piVar4 = dst_cumsum;
      do {
        (*pcVar3)(src_argb,piVar4,dst_cumsum,width);
        src_argb = src_argb + src_stride_argb;
        height = height + -1;
        dst_cumsum = piVar4;
        piVar4 = piVar4 + dst_stride32_cumsum;
      } while (height != 0);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBComputeCumulativeSum(const uint8_t* src_argb,
                             int src_stride_argb,
                             int32_t* dst_cumsum,
                             int dst_stride32_cumsum,
                             int width,
                             int height) {
  int y;
  void (*ComputeCumulativeSumRow)(const uint8_t* row, int32_t* cumsum,
                                  const int32_t* previous_cumsum, int width) =
      ComputeCumulativeSumRow_C;
  int32_t* previous_cumsum = dst_cumsum;
  if (!dst_cumsum || !src_argb || width <= 0 || height <= 0) {
    return -1;
  }
#if defined(HAS_CUMULATIVESUMTOAVERAGEROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ComputeCumulativeSumRow = ComputeCumulativeSumRow_SSE2;
  }
#endif
#if defined(HAS_CUMULATIVESUMTOAVERAGEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ComputeCumulativeSumRow = ComputeCumulativeSumRow_MMI;
  }
#endif

  memset(dst_cumsum, 0, width * sizeof(dst_cumsum[0]) * 4);  // 4 int per pixel.
  for (y = 0; y < height; ++y) {
    ComputeCumulativeSumRow(src_argb, dst_cumsum, previous_cumsum, width);
    previous_cumsum = dst_cumsum;
    dst_cumsum += dst_stride32_cumsum;
    src_argb += src_stride_argb;
  }
  return 0;
}